

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaggageRestrictionManager.cpp
# Opt level: O3

ssize_t __thiscall
jaegertracing::thrift::BaggageRestrictionManager_getBaggageRestrictions_args::read
          (BaggageRestrictionManager_getBaggageRestrictions_args *this,int __fd,void *__buf,
          size_t __nbytes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _func_int **pp_Var5;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  int16_t fid;
  TType ftype;
  string fname;
  short local_66;
  int local_64;
  BaggageRestrictionManager_getBaggageRestrictions_args *local_60;
  string *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  iVar1 = (*this_00->_vptr_TProtocol[0x19])(this_00,&local_50);
  local_58 = &this->serviceName;
  local_60 = this;
  do {
    iVar2 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&local_50,&local_64,&local_66);
    if (local_64 == 0) {
      iVar3 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar3 + iVar2 + iVar1);
    }
    if (local_66 == 1) {
      pp_Var5 = this_00->_vptr_TProtocol;
      if (local_64 != 0xb) goto LAB_001f2020;
      iVar3 = (*pp_Var5[0x2a])(this_00,local_58);
      local_60->__isset =
           (_BaggageRestrictionManager_getBaggageRestrictions_args__isset)
           ((byte)local_60->__isset | 1);
    }
    else {
      pp_Var5 = this_00->_vptr_TProtocol;
LAB_001f2020:
      iVar3 = (*pp_Var5[0x2c])(this_00);
    }
    iVar4 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar1 = iVar3 + iVar2 + iVar1 + iVar4;
  } while( true );
}

Assistant:

uint32_t BaggageRestrictionManager_getBaggageRestrictions_args::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readString(this->serviceName);
          this->__isset.serviceName = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}